

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR ly_pattern_match(ly_ctx *ctx,char *pattern,char *string,uint32_t str_len,pcre2_code_8 **pcode
                       )

{
  pcre2_code_8 *ppVar1;
  LY_ERR LVar2;
  size_t sVar3;
  char *pcVar4;
  pcre2_code_8 *code;
  ly_err_item *err;
  pcre2_code_8 *local_38;
  ly_err_item *local_30;
  
  sVar3 = (size_t)str_len;
  local_30 = (ly_err_item *)0x0;
  if ((pattern == (char *)0x0) &&
     ((pcode == (pcre2_code_8 **)0x0 || (*pcode == (pcre2_code_8 *)0x0)))) {
    pcVar4 = "pattern || (pcode && *pcode)";
  }
  else {
    if (string != (char *)0x0) {
      if (((pcode == (pcre2_code_8 **)0x0) || (ppVar1 = *pcode, *pcode == (pcre2_code_8 *)0x0)) &&
         (LVar2 = lys_compile_type_pattern_check(ctx,pattern,&local_38), ppVar1 = local_38,
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
      local_38 = ppVar1;
      if (str_len == 0) {
        sVar3 = strlen(string);
      }
      LVar2 = ly_pattern_code_match(local_38,string,sVar3 & 0xffffffff,&local_30);
      if ((LVar2 != LY_SUCCESS) && (LVar2 != LY_ENOT)) {
        ly_err_print(ctx,local_30);
        ly_err_free(local_30);
        return LVar2;
      }
      if (pcode == (pcre2_code_8 **)0x0) {
        pcre2_code_free_8(local_38);
        return LVar2;
      }
      if (*pcode != (pcre2_code_8 *)0x0) {
        return LVar2;
      }
      *pcode = local_38;
      return LVar2;
    }
    pcVar4 = "string";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"ly_pattern_match");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_pattern_match(const struct ly_ctx *ctx, const char *pattern, const char *string, uint32_t str_len, pcre2_code **pcode)
{
    LY_ERR r;
    pcre2_code *code;
    struct ly_err_item *err = NULL;

    LY_CHECK_ARG_RET(ctx, pattern || (pcode && *pcode), string, LY_EINVAL);

    if (pcode && *pcode) {
        /* use precompiled pattern */
        code = *pcode;
    } else {
        /* compile the pattern */
        LY_CHECK_RET(lys_compile_type_pattern_check(ctx, pattern, &code));
    }

    /* match */
    if (!str_len) {
        str_len = strlen(string);
    }
    r = ly_pattern_code_match(code, string, str_len, &err);
    if (r && (r != LY_ENOT)) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        return r;
    }

    if (pcode && !*pcode) {
        *pcode = code;
    } else if (!pcode || !*pcode) {
        pcre2_code_free(code);
    }
    return r;
}